

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9_hashmap_product(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  long lVar2;
  undefined8 *puVar3;
  long lVar4;
  double *pdVar5;
  jx9_value *pjVar6;
  uint uVar7;
  int iVar8;
  sxi64 sVar9;
  long *plVar10;
  sxi64 nv;
  double local_40;
  double local_38;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 0x40) != 0)) {
    lVar2 = ((*apArg)->x).iVal;
    iVar8 = *(int *)(lVar2 + 0x2c);
    if (iVar8 != 0) {
      lVar4 = *(long *)**(undefined8 **)(lVar2 + 0x10);
      uVar7 = *(uint *)(*(undefined8 **)(lVar2 + 0x10) + 7);
      if (uVar7 < *(uint *)(lVar4 + 0x210)) {
        lVar4 = (ulong)(uVar7 * *(int *)(lVar4 + 0x218)) + *(long *)(lVar4 + 0x208);
      }
      else {
        lVar4 = 0;
      }
      if (lVar4 != 0) {
        plVar10 = (long *)(lVar2 + 0x10);
        if ((*(byte *)(lVar4 + 8) & 4) != 0) {
          local_38 = 1.0;
          do {
            puVar3 = (undefined8 *)*plVar10;
            lVar2 = *(long *)*puVar3;
            if (*(uint *)(puVar3 + 7) < *(uint *)(lVar2 + 0x210)) {
              pdVar5 = (double *)
                       ((ulong)(*(uint *)(puVar3 + 7) * *(int *)(lVar2 + 0x218)) +
                       *(long *)(lVar2 + 0x208));
            }
            else {
              pdVar5 = (double *)0x0;
            }
            if (pdVar5 != (double *)0x0) {
              uVar7 = *(uint *)(pdVar5 + 1);
              if ((uVar7 & 0x160) == 0) {
                if ((uVar7 & 4) == 0) {
                  if ((uVar7 & 10) == 0) {
                    if (((uVar7 & 1) != 0) && (*(sxu32 *)(pdVar5 + 5) != 0)) {
                      local_40 = 0.0;
                      SyStrToReal((char *)pdVar5[4],*(sxu32 *)(pdVar5 + 5),&local_40,
                                  (char **)(ulong)uVar7);
                      local_38 = local_38 * local_40;
                    }
                  }
                  else {
                    local_38 = local_38 * (double)(long)*pdVar5;
                  }
                }
                else {
                  local_38 = local_38 * *pdVar5;
                }
              }
            }
            plVar10 = puVar3 + 9;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
          pjVar6 = pCtx->pRet;
          jx9MemObjRelease(pjVar6);
          (pjVar6->x).rVal = local_38;
          pjVar6->iFlags = pjVar6->iFlags & 0xfffffe90U | 4;
          jx9MemObjTryInteger(pjVar6);
          return 0;
        }
        sVar9 = 1;
        uVar7 = 0;
        do {
          puVar3 = (undefined8 *)*plVar10;
          lVar4 = *(long *)*puVar3;
          if (*(uint *)(puVar3 + 7) < *(uint *)(lVar4 + 0x210)) {
            pdVar5 = (double *)
                     ((ulong)(*(uint *)(puVar3 + 7) * *(int *)(lVar4 + 0x218)) +
                     *(long *)(lVar4 + 0x208));
          }
          else {
            pdVar5 = (double *)0x0;
          }
          if (pdVar5 != (double *)0x0) {
            uVar1 = *(uint *)(pdVar5 + 1);
            if ((uVar1 & 0x160) == 0) {
              if ((uVar1 & 4) == 0) {
                if ((uVar1 & 10) == 0) {
                  if (((uVar1 & 1) != 0) && (*(sxu32 *)(pdVar5 + 5) != 0)) {
                    local_40 = 0.0;
                    SyStrToInt64((char *)pdVar5[4],*(sxu32 *)(pdVar5 + 5),&local_40,
                                 (char **)(ulong)uVar1);
                    sVar9 = sVar9 * (long)local_40;
                  }
                }
                else {
                  sVar9 = sVar9 * (long)*pdVar5;
                }
              }
              else {
                sVar9 = sVar9 * (long)*pdVar5;
              }
            }
          }
          plVar10 = puVar3 + 9;
          uVar7 = uVar7 + 1;
        } while (uVar7 < *(uint *)(lVar2 + 0x2c));
        pjVar6 = pCtx->pRet;
        jx9MemObjRelease(pjVar6);
        (pjVar6->x).iVal = sVar9;
        goto LAB_00138abf;
      }
    }
  }
  pjVar6 = pCtx->pRet;
  jx9MemObjRelease(pjVar6);
  (pjVar6->x).rVal = 0.0;
LAB_00138abf:
  pjVar6->iFlags = pjVar6->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9_hashmap_product(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap;
	jx9_value *pObj;
	if( nArg < 1 ){
		/* Missing arguments, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid argument, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	if( pMap->nEntry < 1 ){
		/* Nothing to compute, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* If the first element is of type float, then perform floating
	 * point computaion.Otherwise switch to int64 computaion.
	 */
	pObj = HashmapExtractNodeValue(pMap->pFirst);
	if( pObj == 0 ){
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	if( pObj->iFlags & MEMOBJ_REAL ){
		DoubleProd(pCtx, pMap);
	}else{
		Int64Prod(pCtx, pMap);
	}
	return JX9_OK;
}